

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

bool rest_block(any *context,HTTPRequest *req,string *strURIPart,TxVerbosity tx_verbosity)

{
  pointer ppCVar1;
  bool bVar2;
  RESTResponseFormat RVar3;
  ChainstateManager *this;
  Chainstate *pCVar4;
  CBlockIndex *this_00;
  undefined4 in_register_0000000c;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  CBlockIndex *tip;
  BlockManager *this_01;
  long in_FS_OFFSET;
  string_view str;
  span<const_std::byte,_18446744073709551615UL> reply;
  Span<const_unsigned_char> s;
  Span<const_std::byte> sp;
  string strJSON;
  UniValue objBlock;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  DataStream block_stream;
  optional<uint256> hash;
  string hashStr;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  FlatFilePos local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  undefined1 local_248 [32];
  span<const_std::byte,_18446744073709551615UL> local_228;
  UniValue local_208;
  CBlock local_1b0;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  optional<uint256> local_79;
  string local_58;
  long local_38;
  
  pcVar5 = (char *)CONCAT44(in_register_0000000c,tx_verbosity);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CheckWarmup(req);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_00261030;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  RVar3 = ParseDataFormat(&local_58,strURIPart);
  str._M_str = pcVar5;
  str._M_len = (size_t)local_58._M_dataplus._M_p;
  detail::FromHex<uint256>(&local_79,(detail *)local_58._M_string_length,str);
  if (local_79.super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged == false) {
    std::operator+(&local_a0,"Invalid hash: ",&local_58);
    RESTERR(req,HTTP_BAD_REQUEST,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
LAB_00261021:
    bVar2 = false;
  }
  else {
    local_290.nFile = -1;
    local_290.nPos = 0;
    this = GetChainman(context,req);
    if (this == (ChainstateManager *)0x0) goto LAB_00261021;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_1b0,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rest.cpp"
               ,0x132,false);
    pCVar4 = ChainstateManager::ActiveChainstate(this);
    ppCVar1 = (pCVar4->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (pCVar4->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      tip = (CBlockIndex *)0x0;
    }
    else {
      tip = ppCVar1[-1];
    }
    this_01 = &this->m_blockman;
    this_00 = node::BlockManager::LookupBlockIndex(this_01,(uint256 *)&local_79);
    if (this_00 == (CBlockIndex *)0x0) {
      pbVar6 = &local_c0;
      std::operator+(pbVar6,&local_58," not found");
      RESTERR(req,HTTP_NOT_FOUND,pbVar6);
LAB_0026100c:
      std::__cxx11::string::~string((string *)pbVar6);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&local_1b0);
      goto LAB_00261021;
    }
    if ((this_00->nStatus & 8) == 0) {
      bVar2 = node::BlockManager::IsBlockPruned(this_01,this_00);
      if (bVar2) {
        pbVar6 = &local_e0;
        std::operator+(pbVar6,&local_58," not available (pruned data)");
        RESTERR(req,HTTP_NOT_FOUND,pbVar6);
      }
      else {
        pbVar6 = &local_100;
        std::operator+(pbVar6,&local_58," not available (not fully downloaded)");
        RESTERR(req,HTTP_NOT_FOUND,pbVar6);
      }
      goto LAB_0026100c;
    }
    local_290 = CBlockIndex::GetBlockPos(this_00);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&local_1b0);
    local_2a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = node::BlockManager::ReadRawBlockFromDisk
                      (this_01,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8,
                       &local_290);
    if (bVar2) {
      if (RVar3 == JSON) {
        CBlock::CBlock(&local_1b0);
        sp.m_size = (long)local_2a8._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_2a8._M_impl.super__Vector_impl_data._M_start;
        sp.m_data = local_2a8._M_impl.super__Vector_impl_data._M_start;
        DataStream::DataStream((DataStream *)&local_140,sp);
        local_208._0_8_ = &TX_WITH_WITNESS;
        local_208.val._M_dataplus._M_p = (pointer)&local_1b0;
        ParamsWrapper<TransactionSerParams,_CBlock>::Unserialize<DataStream>
                  ((ParamsWrapper<TransactionSerParams,_CBlock> *)(local_248 + 0x40),
                   (DataStream *)&local_140);
        blockToJSON((UniValue *)(local_248 + 0x40),this_01,&local_1b0,tip,this_00,tx_verbosity);
        UniValue::write_abi_cxx11_((UniValue *)local_248,(int)local_248 + 0x40,(void *)0x0,0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_248 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248,"\n");
        std::__cxx11::string::~string((string *)local_248);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_248,"Content-Type",&local_2a9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"application/json",&local_2aa);
        HTTPRequest::WriteHeader(req,(string *)local_248,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)local_248);
        HTTPRequest::WriteReply(req,200,local_228);
        std::__cxx11::string::~string((string *)(local_248 + 0x20));
        UniValue::~UniValue((UniValue *)(local_248 + 0x40));
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_140);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)((long)&local_1b0 + 0x50));
      }
      else {
        if (RVar3 != HEX) {
          if (RVar3 != BINARY) {
            AvailableDataFormatsString_abi_cxx11_();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1b0,"output format not found (available: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_248 + 0x40));
            std::operator+(&local_288,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1b0,")");
            RESTERR(req,HTTP_NOT_FOUND,&local_288);
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::~string((string *)&local_1b0);
            pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_248 + 0x40);
            goto LAB_00261094;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"Content-Type",(allocator<char> *)&local_140);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_248 + 0x40),"application/octet-stream",
                     (allocator<char> *)(local_248 + 0x20));
          HTTPRequest::WriteHeader(req,(string *)&local_1b0,(string *)(local_248 + 0x40));
          std::__cxx11::string::~string((string *)(local_248 + 0x40));
          std::__cxx11::string::~string((string *)&local_1b0);
          reply._M_extent._M_extent_value =
               (long)local_2a8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_2a8._M_impl.super__Vector_impl_data._M_start;
          bVar2 = true;
          reply._M_ptr = local_2a8._M_impl.super__Vector_impl_data._M_start;
          HTTPRequest::WriteReply(req,200,reply);
          goto LAB_002612c6;
        }
        s.m_size = (long)local_2a8._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2a8._M_impl.super__Vector_impl_data._M_start;
        s.m_data = local_2a8._M_impl.super__Vector_impl_data._M_start;
        HexStr_abi_cxx11_((string *)(local_248 + 0x40),s);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_248 + 0x40),"\n");
        std::__cxx11::string::~string((string *)(local_248 + 0x40));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_248 + 0x40),"Content-Type",(allocator<char> *)(local_248 + 0x20)
                  );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"text/plain",(allocator<char> *)local_248);
        HTTPRequest::WriteHeader(req,(string *)(local_248 + 0x40),&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)(local_248 + 0x40));
        HTTPRequest::WriteReply
                  (req,200,(span<const_std::byte,_18446744073709551615UL>)
                           local_1b0.super_CBlockHeader._0_16_);
        std::__cxx11::string::~string((string *)&local_1b0);
      }
      bVar2 = true;
    }
    else {
      std::operator+(&local_120,&local_58," not found");
      RESTERR(req,HTTP_NOT_FOUND,&local_120);
      pbVar6 = &local_120;
LAB_00261094:
      std::__cxx11::string::~string((string *)pbVar6);
      bVar2 = false;
    }
LAB_002612c6:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2a8);
  }
  std::__cxx11::string::~string((string *)&local_58);
LAB_00261030:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_block(const std::any& context,
                       HTTPRequest* req,
                       const std::string& strURIPart,
                       TxVerbosity tx_verbosity)
{
    if (!CheckWarmup(req))
        return false;
    std::string hashStr;
    const RESTResponseFormat rf = ParseDataFormat(hashStr, strURIPart);

    auto hash{uint256::FromHex(hashStr)};
    if (!hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + hashStr);
    }

    FlatFilePos pos{};
    const CBlockIndex* pblockindex = nullptr;
    const CBlockIndex* tip = nullptr;
    ChainstateManager* maybe_chainman = GetChainman(context, req);
    if (!maybe_chainman) return false;
    ChainstateManager& chainman = *maybe_chainman;
    {
        LOCK(cs_main);
        tip = chainman.ActiveChain().Tip();
        pblockindex = chainman.m_blockman.LookupBlockIndex(*hash);
        if (!pblockindex) {
            return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not found");
        }
        if (!(pblockindex->nStatus & BLOCK_HAVE_DATA)) {
            if (chainman.m_blockman.IsBlockPruned(*pblockindex)) {
                return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not available (pruned data)");
            }
            return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not available (not fully downloaded)");
        }
        pos = pblockindex->GetBlockPos();
    }

    std::vector<uint8_t> block_data{};
    if (!chainman.m_blockman.ReadRawBlockFromDisk(block_data, pos)) {
        return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not found");
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, std::as_bytes(std::span{block_data}));
        return true;
    }

    case RESTResponseFormat::HEX: {
        const std::string strHex{HexStr(block_data) + "\n"};
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }

    case RESTResponseFormat::JSON: {
        CBlock block{};
        DataStream block_stream{block_data};
        block_stream >> TX_WITH_WITNESS(block);
        UniValue objBlock = blockToJSON(chainman.m_blockman, block, *tip, *pblockindex, tx_verbosity);
        std::string strJSON = objBlock.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }

    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}